

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextDocumentLayoutPrivate::relayout(QPlainTextDocumentLayoutPrivate *this)

{
  QPlainTextDocumentLayout *pQVar1;
  ulong uVar2;
  QPlainTextDocumentLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlainTextDocumentLayout *q;
  QTextBlock block;
  QRectF local_48;
  QTextBlock local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractTextDocumentLayout::document();
  QTextDocument::firstBlock();
  while (uVar2 = QTextBlock::isValid(), (uVar2 & 1) != 0) {
    QTextBlock::layout();
    QTextLayout::clearLayout();
    QTextBlock::isVisible();
    QTextBlock::setLineCount((int)local_18);
    QTextBlock::next();
    QTextBlock::operator=((QTextBlock *)local_18,&local_28);
  }
  QRectF::QRectF(&local_48,0.0,0.0,1000000000.0,1000000000.0);
  QAbstractTextDocumentLayout::update((QRectF *)pQVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextDocumentLayoutPrivate::relayout()
{
    Q_Q(QPlainTextDocumentLayout);
    QTextBlock block = q->document()->firstBlock();
    while (block.isValid()) {
        block.layout()->clearLayout();
        block.setLineCount(block.isVisible() ? 1 : 0);
        block = block.next();
    }
    emit q->update();
}